

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O0

void delete_callbacks_for_context(void *ctx)

{
  callback *pcVar1;
  callback *ptr;
  callback *cb;
  callback *newtail;
  callback *newhead;
  void *ctx_local;
  
  cb = (callback *)0x0;
  newtail = (callback *)0x0;
  while (ptr = cbhead, cbhead != (callback *)0x0) {
    pcVar1 = cbhead->next;
    if ((cbhead->ctx == ctx) ||
       ((cbhead->fn == run_idempotent_callback && (*(void **)((long)cbhead->ctx + 8) == ctx)))) {
      cbhead = pcVar1;
      safefree(ptr);
    }
    else {
      if (newtail == (callback *)0x0) {
        newtail = cbhead;
        cbhead = pcVar1;
      }
      else {
        cb->next = cbhead;
        cbhead = pcVar1;
      }
      cb = ptr;
    }
  }
  cbhead = newtail;
  cbtail = cb;
  if (cb != (callback *)0x0) {
    cb->next = (callback *)0x0;
  }
  return;
}

Assistant:

void delete_callbacks_for_context(void *ctx)
{
    struct callback *newhead, *newtail;

    newhead = newtail = NULL;
    while (cbhead) {
        struct callback *cb = cbhead;
        cbhead = cbhead->next;
        if (cb->ctx == ctx ||
            (cb->fn == run_idempotent_callback &&
             ((struct IdempotentCallback *)cb->ctx)->ctx == ctx)) {
            sfree(cb);
        } else {
            if (!newhead)
                newhead = cb;
            else
                newtail->next = cb;

            newtail = cb;
        }
    }

    cbhead = newhead;
    cbtail = newtail;
    if (newtail)
        newtail->next = NULL;
}